

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCWrap(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *privkey,size_t privkey_len)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  octet *poVar9;
  char *oid;
  octet *poVar10;
  octet *poVar11;
  octet *poVar12;
  octet *poVar13;
  size_t sVar14;
  der_anchor_t CertHAT [1];
  der_anchor_t PubKey [1];
  der_anchor_t CVCert [1];
  der_anchor_t DDT [1];
  der_anchor_t CVExt [1];
  bign_params params [1];
  
  bVar2 = memIsValid(cvc,0x128);
  eVar3 = 0x6d;
  if ((((bVar2 != 0) && (uVar1 = privkey_len - 0x18 >> 3, (privkey_len << 0x3d | uVar1) < 6)) &&
      ((0x2bUL >> (uVar1 & 0x3f) & 1) != 0)) &&
     ((bVar2 = memIsValid(privkey,privkey_len), bVar2 != 0 &&
      ((cert_len == (size_t *)0x0 || (bVar2 = memIsValid(cert_len,8), bVar2 != 0)))))) {
    if (cvc->pubkey_len == 0) {
      poVar10 = cvc->pubkey;
      eVar3 = btokParamsStd(params,privkey_len);
      if (eVar3 == 0) {
        if (privkey_len == 0x18) {
          eVar3 = bign96PubkeyCalc(poVar10,params,privkey);
        }
        else {
          eVar3 = bignPubkeyCalc(poVar10,params,privkey);
        }
      }
      if (eVar3 != 0) {
        return eVar3;
      }
      cvc->pubkey_len = privkey_len * 2;
      memSet(poVar10 + privkey_len * 2,'\0',privkey_len * -2 + 0x80);
    }
    eVar3 = btokCVCCheck(cvc);
    if (eVar3 == 0) {
      sVar5 = derTSEQEncStart(CVCert,cert,0,0x7f21);
      poVar10 = cert + sVar5;
      if (cert == (octet *)0x0) {
        poVar10 = (octet *)0x0;
      }
      bVar2 = memIsValid(cvc,0x128);
      sVar14 = 0xffffffffffffffff;
      if ((bVar2 != 0) && (bVar2 = btokCVCNameIsValid(cvc->authority), bVar2 != 0)) {
        bVar2 = btokCVCNameIsValid(cvc->holder);
        if (bVar2 != 0) {
          poVar9 = cvc->from;
          bVar2 = tmDateIsValid2(poVar9);
          if (bVar2 != 0) {
            poVar12 = cvc->until;
            bVar2 = tmDateIsValid2(poVar12);
            if ((((bVar2 != 0) && (iVar4 = memCmp(poVar9,poVar12,6), iVar4 < 1)) &&
                (uVar1 = cvc->pubkey_len - 0x30 >> 4, (cvc->pubkey_len << 0x3c | uVar1) < 6)) &&
               ((0x2bUL >> (uVar1 & 0x3f) & 1) != 0)) {
              sVar14 = derTSEQEncStart((der_anchor_t *)params,poVar10,0,0x7f4e);
              poVar11 = poVar10 + sVar14;
              if (poVar10 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar6 = derTSIZEEnc(poVar11,0x5f29,0);
              poVar13 = poVar11 + sVar6;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar7 = derTPSTREnc(poVar13,0x42,cvc->authority);
              poVar11 = poVar13 + sVar7;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar7 = sVar6 + sVar14 + sVar7;
              sVar14 = derTSEQEncStart(PubKey,poVar11,sVar7,0x7f49);
              poVar13 = poVar11 + sVar14;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar6 = derOIDEnc(poVar13,"1.2.112.0.2.0.34.101.45.2.1");
              poVar11 = poVar13 + sVar6;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar8 = derTBITEnc(poVar11,3,cvc->pubkey,cvc->pubkey_len << 3);
              poVar13 = poVar11 + sVar8;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar8 = sVar7 + sVar14 + sVar6 + sVar8;
              sVar14 = derTSEQEncStop(poVar13,sVar8,PubKey);
              poVar11 = poVar13 + sVar14;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar6 = derTPSTREnc(poVar11,0x5f20,cvc->holder);
              poVar13 = poVar11 + sVar6;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar6 = sVar8 + sVar14 + sVar6;
              bVar2 = memIsZero(cvc->hat_eid,5);
              if (bVar2 == 0) {
                sVar14 = derTSEQEncStart(CertHAT,poVar13,sVar6,0x7f4c);
                poVar11 = poVar13 + sVar14;
                if (poVar13 == (octet *)0x0) {
                  poVar11 = (octet *)0x0;
                }
                sVar7 = derOIDEnc(poVar11,"1.2.112.0.2.0.34.101.79.6.1");
                poVar13 = poVar11 + sVar7;
                if (poVar11 == (octet *)0x0) {
                  poVar13 = (octet *)0x0;
                }
                sVar8 = derEnc(poVar13,4,cvc->hat_eid,5);
                poVar11 = poVar13 + sVar8;
                if (poVar13 == (octet *)0x0) {
                  poVar11 = (octet *)0x0;
                }
                sVar8 = sVar14 + sVar6 + sVar7 + sVar8;
                sVar6 = derTSEQEncStop(poVar11,sVar8,CertHAT);
                poVar13 = poVar11 + sVar6;
                if (poVar11 == (octet *)0x0) {
                  poVar13 = (octet *)0x0;
                }
                sVar6 = sVar8 + sVar6;
              }
              sVar14 = derEnc(poVar13,0x5f25,poVar9,6);
              poVar9 = poVar13 + sVar14;
              if (poVar13 == (octet *)0x0) {
                poVar9 = (octet *)0x0;
              }
              sVar7 = derEnc(poVar9,0x5f24,poVar12,6);
              poVar12 = poVar9 + sVar7;
              if (poVar9 == (octet *)0x0) {
                poVar12 = (octet *)0x0;
              }
              sVar7 = sVar6 + sVar14 + sVar7;
              bVar2 = memIsZero(cvc->hat_esign,2);
              if (bVar2 == 0) {
                sVar14 = derTSEQEncStart(CVExt,poVar12,sVar7,0x65);
                poVar9 = poVar12 + sVar14;
                if (poVar12 == (octet *)0x0) {
                  poVar9 = (octet *)0x0;
                }
                sVar6 = derTSEQEncStart(DDT,poVar9,sVar14 + sVar7,0x73);
                poVar12 = poVar9 + sVar6;
                if (poVar9 == (octet *)0x0) {
                  poVar12 = (octet *)0x0;
                }
                sVar8 = derOIDEnc(poVar12,"1.2.112.0.2.0.34.101.79.8.1");
                poVar9 = poVar12 + sVar8;
                if (poVar12 == (octet *)0x0) {
                  poVar9 = (octet *)0x0;
                }
                sVar8 = sVar14 + sVar7 + sVar6 + sVar8;
                sVar14 = derTSEQEncStart(CertHAT,poVar9,sVar8,0x7f4c);
                poVar12 = poVar9 + sVar14;
                if (poVar9 == (octet *)0x0) {
                  poVar12 = (octet *)0x0;
                }
                sVar6 = derOIDEnc(poVar12,"1.2.112.0.2.0.34.101.79.6.2");
                poVar9 = poVar12 + sVar6;
                if (poVar12 == (octet *)0x0) {
                  poVar9 = (octet *)0x0;
                }
                sVar7 = derEnc(poVar9,4,cvc->hat_esign,2);
                poVar12 = poVar9 + sVar7;
                if (poVar9 == (octet *)0x0) {
                  poVar12 = (octet *)0x0;
                }
                sVar7 = sVar8 + sVar14 + sVar6 + sVar7;
                sVar14 = derTSEQEncStop(poVar12,sVar7,CertHAT);
                poVar9 = poVar12 + sVar14;
                if (poVar12 == (octet *)0x0) {
                  poVar9 = (octet *)0x0;
                }
                sVar7 = sVar7 + sVar14;
                sVar14 = derTSEQEncStop(poVar9,sVar7,DDT);
                poVar11 = poVar9 + sVar14;
                if (poVar9 == (octet *)0x0) {
                  poVar11 = (octet *)0x0;
                }
                sVar7 = sVar7 + sVar14;
                sVar14 = derTSEQEncStop(poVar11,sVar7,CVExt);
                poVar12 = poVar11 + sVar14;
                if (poVar11 == (octet *)0x0) {
                  poVar12 = (octet *)0x0;
                }
                sVar7 = sVar7 + sVar14;
              }
              sVar14 = derTSEQEncStop(poVar12,sVar7,(der_anchor_t *)params);
              sVar14 = sVar14 + sVar7;
            }
          }
        }
      }
      if (poVar10 != (octet *)0x0) {
        CertHAT[0].der = (octet *)0x10;
        eVar3 = btokParamsStd(params,privkey_len);
        if (eVar3 == 0) {
          if (privkey_len < 0x21) {
            sVar6 = beltHash_keep();
          }
          else {
            sVar6 = bashHash_keep();
          }
          poVar9 = (octet *)blobCreate(sVar6 + privkey_len * 2);
          if (poVar9 == (octet *)0x0) {
            eVar3 = 0x6e;
          }
          else {
            poVar11 = poVar9 + privkey_len;
            poVar12 = poVar11 + privkey_len;
            if (privkey_len < 0x21) {
              beltHashStart(poVar12);
              beltHashStepH(poVar10,sVar14,poVar12);
              beltHashStepG2(poVar9,privkey_len,poVar12);
              oid = "1.2.112.0.2.0.34.101.31.81";
            }
            else {
              bashHashStart(poVar12,privkey_len * 4);
              bashHashStepH(poVar10,sVar14,poVar12);
              bashHashStepG(poVar9,privkey_len,poVar12);
              oid = "1.2.112.0.2.0.34.101.77.13";
              if (privkey_len == 0x30) {
                oid = "1.2.112.0.2.0.34.101.77.12";
              }
            }
            eVar3 = bignOidToDER((octet *)PubKey,(size_t *)CertHAT,oid);
            if (eVar3 == 0) {
              sVar6 = 0;
              bVar2 = rngIsValid();
              if (bVar2 != 0) {
                rngStepR(poVar11,privkey_len,(void *)0x0);
                sVar6 = privkey_len;
              }
              poVar12 = poVar9;
              if (privkey_len == 0x18) {
                eVar3 = bign96Sign2(cvc->sig,params,(octet *)PubKey,(size_t)CertHAT[0].der,poVar9,
                                    privkey,poVar11,sVar6);
              }
              else {
                eVar3 = bignSign2(cvc->sig,params,(octet *)PubKey,(size_t)CertHAT[0].der,poVar9,
                                  privkey,poVar11,sVar6);
              }
            }
            blobClose(poVar12);
          }
        }
        if (eVar3 != 0) {
          return eVar3;
        }
      }
      poVar9 = poVar10 + sVar14;
      if (poVar10 == (octet *)0x0) {
        poVar9 = (octet *)0x0;
      }
      sVar6 = 0x22;
      if (privkey_len != 0x18) {
        sVar6 = (privkey_len >> 1) + privkey_len;
      }
      cvc->sig_len = sVar6;
      sVar6 = derEnc(poVar9,0x5f37,cvc->sig,sVar6);
      poVar10 = poVar9 + sVar6;
      if (poVar9 == (octet *)0x0) {
        poVar10 = (octet *)0x0;
      }
      sVar6 = sVar5 + sVar14 + sVar6;
      sVar5 = derTSEQEncStop(poVar10,sVar6,CVCert);
      eVar3 = 0;
      if (cert_len != (size_t *)0x0) {
        *cert_len = sVar6 + sVar5;
      }
    }
  }
  return eVar3;
}

Assistant:

err_t btokCVCWrap(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet privkey[], size_t privkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t count = 0;
	size_t t;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		privkey_len != 24 && 
			privkey_len != 32 && privkey_len != 48 && privkey_len != 64 ||
		!memIsValid(privkey, privkey_len) ||
		!memIsNullOrValid(cert_len, O_PER_S))
		return ERR_BAD_INPUT;
	// построить открытый ключ
	if (cvc->pubkey_len == 0)
	{
		code = btokPubkeyCalc(cvc->pubkey, privkey, privkey_len);
		ERR_CALL_CHECK(code);
		cvc->pubkey_len = 2 * privkey_len;
		memSetZero(cvc->pubkey + cvc->pubkey_len,
			sizeof(cvc->pubkey) - cvc->pubkey_len);
	}
	// проверить содержимое сертификата
	code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	// начать кодирование...
	t = derTSEQEncStart(CVCert, cert, count, 0x7F21);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...кодировать и подписать основную часть...
	t = btokCVCBodyEnc(cert, cvc);
	ASSERT(t != SIZE_MAX);
	if (cert)
	{
		code = btokSign(cvc->sig, cert, t, privkey, privkey_len);
		ERR_CALL_CHECK(code);
	}
	cert = cert ? cert + t : 0, count += t;
	if (privkey_len == 24)
		cvc->sig_len = 34;
	else
		cvc->sig_len = privkey_len + privkey_len / 2;
	// ...кодировать подпись...
	t = derTOCTEnc(cert, 0x5F37, cvc->sig, cvc->sig_len);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...завершить кодирование
	t = derTSEQEncStop(cert, count, CVCert);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// возвратить длину DER-кода
	if (cert_len)
		*cert_len = count;
	return ERR_OK;
}